

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O3

void drawMap(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  uint8_t *puVar4;
  int _x;
  long lVar5;
  int c;
  long lVar6;
  int y_00;
  int y;
  int iVar7;
  int x;
  int iVar8;
  char *pcVar9;
  undefined1 auVar10 [16];
  long lVar11;
  
  iVar8 = 0;
  do {
    y_00 = 0;
    iVar7 = 0;
    do {
      c = 0;
      if (((uint)(map_view_x + iVar8) < 0x50) && (c = 0, (uint)(map_view_y + iVar7) < 0x20)) {
        c = map_buffer[(uint)((map_view_y + iVar7) * 0x50 + map_view_x + iVar8)];
      }
      drawChar(iVar8 * 4,y_00,c);
      auVar2 = _DAT_00149470;
      auVar1 = _DAT_00149460;
      iVar7 = iVar7 + 1;
      y_00 = y_00 + 6;
    } while (iVar7 != 10);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x20);
  puVar4 = jedi_screen_buffer + 0x1d80;
  lVar5 = 0;
  do {
    lVar6 = 0;
    auVar10 = auVar1;
    do {
      if (SUB164(auVar10 ^ auVar2,4) == -0x80000000 && SUB164(auVar10 ^ auVar2,0) < -0x7ffffffa) {
        puVar4[lVar6 + -0x80] = 0xff;
        puVar4[lVar6] = 0xff;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar6 = lVar6 + 0x100;
    } while (lVar6 != 0x300);
    lVar5 = lVar5 + 1;
    puVar4 = puVar4 + 1;
  } while (lVar5 != 0x80);
  if (status_line[0] != '\0') {
    iVar8 = 0;
    pcVar9 = status_line;
    cVar3 = status_line[0];
    do {
      pcVar9 = pcVar9 + 1;
      drawChar(iVar8,0x3a,(int)cVar3 | 0x100);
      cVar3 = *pcVar9;
      iVar8 = iVar8 + 4;
    } while (cVar3 != '\0');
  }
  return;
}

Assistant:

static void drawMap()
{
    for(int x=0; x<DISPLAY_WIDTH / 4; x++)
    {
        for(int y=0; y<DISPLAY_HEIGHT / 6; y++)
        {
            int n = 0;
            if ((x + map_view_x) >= 0 && (x + map_view_x) < NUMCOLS && (y + map_view_y) >= 0 && (y + map_view_y) < NUMLINES)
                n = map_buffer[(x + map_view_x) + (y + map_view_y) * NUMCOLS];

            drawChar(x*4, y*6, n);
        }
    }
    fillBox(0, DISPLAY_HEIGHT-6, DISPLAY_WIDTH, 6, 255);
    for(char* c=status_line; *c; c++)
    {
        drawChar((c-status_line)*4, DISPLAY_HEIGHT-6, (*c) | DISPLAY_INVERT);
    }
}